

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O0

_Bool uint_spbset_chunk_first(uint_spbset_chunk *chunk,uint *pfirst)

{
  ulong uVar1;
  int iVar2;
  uint local_24;
  uint i;
  uint *pfirst_local;
  uint_spbset_chunk *chunk_local;
  
  local_24 = 0;
  while( true ) {
    if (3 < local_24) {
      *pfirst = 0xffffffff;
      return false;
    }
    if (chunk->slots[local_24] != 0) break;
    local_24 = local_24 + 1;
  }
  iVar2 = 0;
  for (uVar1 = chunk->slots[local_24]; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
    iVar2 = iVar2 + 1;
  }
  *pfirst = chunk->offset + local_24 * 0x40 + iVar2;
  return true;
}

Assistant:

static bool uint_spbset_chunk_first(struct uint_spbset_chunk *chunk,
                                    unsigned int *pfirst)
{
  unsigned int i;
  for(i = 0; i < CURL_UINT_SPBSET_CH_SLOTS; ++i) {
    if(chunk->slots[i]) {
      *pfirst = chunk->offset + ((i * 64) + CURL_CTZ64(chunk->slots[i]));
      return TRUE;
    }
  }
  *pfirst = UINT_MAX; /* a value we cannot store */
  return FALSE;
}